

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::NegativeGLSLCompileTime::Run(NegativeGLSLCompileTime *this)

{
  bool bVar1;
  ostream *poVar2;
  int binding;
  int binding_00;
  long lVar3;
  GLint bindings;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90dd,&bindings);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"\nbuffer Buffer { int x = 10; };\nvoid main() {\n  x = 0;\n}",
             (allocator<char> *)&local_1c8);
  bVar1 = Compile(this,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  lVar3 = -1;
  if (bVar1) {
    gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
              ((string *)local_1a8,(NegativeGLSLCompileTime *)0xffffffffffffffff,binding);
    bVar1 = Compile(this,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    if (bVar1) {
      gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
                ((string *)local_1a8,(NegativeGLSLCompileTime *)(ulong)(uint)bindings,binding_00);
      bVar1 = Compile(this,(string *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
        poVar2 = std::operator<<((ostream *)(local_1a8 + 0x10),"\nlayout(binding = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,bindings + -2);
        std::operator<<(poVar2,
                        ") buffer Buffer {\n  int x;\n} g_array[4];\nvoid main() {\n  g_array[0].x = 0;\n  g_array[1].x = 0;\n  g_array[2].x = 0;\n  g_array[3].x = 0;\n}"
                       );
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
        bVar1 = Compile(this,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1a8,"\nbuffer int x;\nvoid main() {\n  x = 0;\n}",
                     (allocator<char> *)&local_1c8);
          bVar1 = Compile(this,(string *)local_1a8);
          std::__cxx11::string::~string((string *)local_1a8);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1a8,
                       "\nbuffer Buffer { int y; };\nvoid main() {\n  y = 0;\n  buffer int x = 0;\n}"
                       ,(allocator<char> *)&local_1c8);
            bVar1 = Compile(this,(string *)local_1a8);
            std::__cxx11::string::~string((string *)local_1a8);
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1a8,
                         "\nbuffer Buffer { int y; };\nvoid Modify(buffer int a) {\n  atomicAdd(a, 1);\n}\nvoid main() {\n  Modify(y);\n}"
                         ,(allocator<char> *)&local_1c8);
              bVar1 = Compile(this,(string *)local_1a8);
              std::__cxx11::string::~string((string *)local_1a8);
              if (bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_1a8,
                           "\nlayout(std430) uniform UBO { int x; };\nbuffer SSBO { int y; };\nvoid main() {\n  y = x;\n}"
                           ,(allocator<char> *)&local_1c8);
                bVar1 = Compile(this,(string *)local_1a8);
                std::__cxx11::string::~string((string *)local_1a8);
                if (bVar1) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_1a8,
                             "\nbuffer SSBO {\n  layout(std430) int x;\n};\nvoid main() {\n  x = 0;\n}"
                             ,(allocator<char> *)&local_1c8);
                  bVar1 = Compile(this,(string *)local_1a8);
                  std::__cxx11::string::~string((string *)local_1a8);
                  if (bVar1) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_1a8,
                               "\nbuffer SSBO {\n  layout(binding = 1) int x;\n};\nvoid main() {\n  x = 0;\n}"
                               ,(allocator<char> *)&local_1c8);
                    bVar1 = Compile(this,(string *)local_1a8);
                    std::__cxx11::string::~string((string *)local_1a8);
                    if (bVar1) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_1a8,
                                 "\nreadonly buffer SSBO {\n  int x;\n};\nvoid main() {\n  x = 0;\n}"
                                 ,(allocator<char> *)&local_1c8);
                      bVar1 = Compile(this,(string *)local_1a8);
                      std::__cxx11::string::~string((string *)local_1a8);
                      if (bVar1) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_1a8,
                                   "\nbuffer SSBO {\n  int x;\n};\nwriteonly buffer SSBO2 {\n  int y;\n};\nvoid main() {\n  x = y;\n}"
                                   ,(allocator<char> *)&local_1c8);
                        bVar1 = Compile(this,(string *)local_1a8);
                        std::__cxx11::string::~string((string *)local_1a8);
                        if (bVar1) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_1a8,
                                     "\nbuffer SSBO {\n  int x;\n};\nbuffer SSBO2 {\n  writeonly int y;\n  readonly int z;\n};\nvoid main() {\n  x = y;\n  z = 0;\n}"
                                     ,(allocator<char> *)&local_1c8);
                          bVar1 = Compile(this,(string *)local_1a8);
                          std::__cxx11::string::~string((string *)local_1a8);
                          if (bVar1) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_1a8,
                                       "\nbuffer SSBO {\n  int x;\n};\nreadonly buffer SSBO2 {\n  writeonly int y;\n};\nvoid main() {\n  x = y;\n}"
                                       ,(allocator<char> *)&local_1c8);
                            bVar1 = Compile(this,(string *)local_1a8);
                            std::__cxx11::string::~string((string *)local_1a8);
                            if (bVar1) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_1a8,
                                         "\nlayout(binding = 1) buffer;\nbuffer SSBO {\n  int x;\n};\nvoid main() {\n  x = 0;\n}"
                                         ,(allocator<char> *)&local_1c8);
                              bVar1 = Compile(this,(string *)local_1a8);
                              std::__cxx11::string::~string((string *)local_1a8);
                              if (bVar1) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_1a8,
                                           "\nbuffer Buffer { int x; };\nint y;\nvoid main() {\n  atomicAdd(x, 1);\n  atomicAdd(y, 2);\n}"
                                           ,(allocator<char> *)&local_1c8);
                                bVar1 = Compile(this,(string *)local_1a8);
                                std::__cxx11::string::~string((string *)local_1a8);
                                if (bVar1) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_1a8,
                                             "\nbuffer b {\n  vec4 x[10];\n};\nvoid main() {\n  vec4 y = vec4(x);\n}"
                                             ,(allocator<char> *)&local_1c8);
                                  bVar1 = Compile(this,(string *)local_1a8);
                                  std::__cxx11::string::~string((string *)local_1a8);
                                  lVar3 = (ulong)bVar1 - 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		GLint bindings;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);

		//  initialization of buffer block member 'x' not allowed
		if (!Compile(NL "buffer Buffer { int x = 10; };" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  syntax error, unexpected '-', expecting integer constant or unsigned integer constant at token "-"
		if (!Compile(Shader1(-1)))
			return ERROR;
		//  invalid value 96 for layout specifier 'binding'
		if (!Compile(Shader1(bindings)))
			return ERROR;

		//  invalid value 98 for layout specifier 'binding'
		if (!Compile(Shader2(bindings - 2)))
			return ERROR;

		//  OpenGL does not allow declaring buffer variable 'x' in the global scope. Use buffer blocks instead
		if (!Compile(NL "buffer int x;" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		// OpenGL requires buffer variables to be declared in a shader storage block in the global scope
		if (!Compile(NL "buffer Buffer { int y; };" NL "void main() {" NL "  y = 0;" NL "  buffer int x = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow a parameter to be a buffer
		if (!Compile(NL "buffer Buffer { int y; };" NL "void Modify(buffer int a) {" NL "  atomicAdd(a, 1);" NL "}" NL
						"void main() {" NL "  Modify(y);" NL "}"))
			return ERROR;

		//  layout specifier 'std430', incompatible with 'uniform blocks'
		if (!Compile(NL "layout(std430) uniform UBO { int x; };" NL "buffer SSBO { int y; };" NL "void main() {" NL
						"  y = x;" NL "}"))
			return ERROR;

		//  unknown layout specifier 'std430'
		if (!Compile(NL "buffer SSBO {" NL "  layout(std430) int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  unknown layout specifier 'binding = 1'
		if (!Compile(NL "buffer SSBO {" NL "  layout(binding = 1) int x;" NL "};" NL "void main() {" NL "  x = 0;" NL
						"}"))
			return ERROR;

		//  OpenGL does not allow writing to readonly variable 'x'
		if (!Compile(NL "readonly buffer SSBO {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow reading writeonly variable 'y'
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "writeonly buffer SSBO2 {" NL "  int y;" NL "};" NL
						"void main() {" NL "  x = y;" NL "}"))
			return ERROR;

		//  OpenGL does not allow writing to readonly variable 'z'
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "buffer SSBO2 {" NL "  writeonly int y;" NL
						"  readonly int z;" NL "};" NL "void main() {" NL "  x = y;" NL "  z = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow having both readonly and writeonly qualifiers on a variable
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "readonly buffer SSBO2 {" NL "  writeonly int y;" NL
						"};" NL "void main() {" NL "  x = y;" NL "}"))
			return ERROR;

		// ["layout(binding = 1) buffer;" should cause compile-time error
		if (!Compile(NL "layout(binding = 1) buffer;" NL "buffer SSBO {" NL "  int x;" NL "};" NL "void main() {" NL
						"  x = 0;" NL "}"))
			return ERROR;

		// ["  atomicAdd(y, 2);"  should cause compile-time error
		if (!Compile(NL "buffer Buffer { int x; };" NL "int y;" NL "void main() {" NL "  atomicAdd(x, 1);" NL
						"  atomicAdd(y, 2);" //
					 NL "}"))
			return ERROR;

		if (!Compile( // can't construct vector from an array
				NL "buffer b {" NL "  vec4 x[10];" NL "};" NL "void main() {" NL "  vec4 y = vec4(x);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}